

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_primary_expression(Parser *this)

{
  bool bVar1;
  IdentifierExpression *this_00;
  Expression *pEVar2;
  IdentifierExpression *expression;
  string *this_01;
  Token oper;
  undefined1 local_208 [48];
  undefined1 local_1d8 [48];
  undefined1 local_1a8 [48];
  undefined1 local_178 [48];
  undefined1 local_148 [48];
  undefined1 local_118 [48];
  undefined1 local_e8 [48];
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  undefined1 local_58 [48];
  
  oper.lexem._M_dataplus._M_p = (pointer)&oper.lexem.field_2;
  oper.lexem._M_string_length = 0;
  oper.lexem.field_2._M_local_buf[0] = '\0';
  bVar1 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar1) {
    Token::operator=(&oper,(this->matched)._M_current);
    this_00 = (IdentifierExpression *)operator_new(0x60);
    pEVar2 = parse_assignment_expression(this);
    ParenthesisExpression::ParenthesisExpression((ParenthesisExpression *)this_00,&oper,pEVar2);
    expect(this,TK_RIGHT_PARENTHESIS);
  }
  else {
    bVar1 = match(this,TK_DOLAR);
    if (bVar1) {
      Token::operator=(&oper,(this->matched)._M_current);
      expect(this,TK_LITERAL_STRING);
      this_00 = (IdentifierExpression *)operator_new(0x60);
      pEVar2 = (Expression *)operator_new(0x58);
      Token::Token((Token *)local_58,(this->matched)._M_current);
      LiteralStringExpression::LiteralStringExpression
                ((LiteralStringExpression *)pEVar2,(Token *)local_58);
      DolarExpression::DolarExpression((DolarExpression *)this_00,&oper,pEVar2);
      this_01 = (string *)(local_58 + 0x10);
    }
    else {
      bVar1 = match(this,TK_AT);
      if (bVar1) {
        Token::operator=(&oper,(this->matched)._M_current);
        this_00 = (IdentifierExpression *)operator_new(0x60);
        expression = parse_identifier_expression(this);
        AtExpression::AtExpression((AtExpression *)this_00,&oper,&expression->super_Expression);
        goto LAB_00156499;
      }
      bVar1 = match(this,TK_LITERAL_INTEGER);
      if (bVar1) {
        this_00 = (IdentifierExpression *)operator_new(0x58);
        Token::Token((Token *)local_88,(this->matched)._M_current);
        LiteralIntegerExpression::LiteralIntegerExpression
                  ((LiteralIntegerExpression *)this_00,(Token *)local_88);
        this_01 = (string *)(local_88 + 0x10);
      }
      else {
        bVar1 = match(this,TK_LITERAL_CHAR);
        if (bVar1) {
          this_00 = (IdentifierExpression *)operator_new(0x58);
          Token::Token((Token *)local_b8,(this->matched)._M_current);
          LiteralCharExpression::LiteralCharExpression
                    ((LiteralCharExpression *)this_00,(Token *)local_b8);
          this_01 = (string *)(local_b8 + 0x10);
        }
        else {
          bVar1 = match(this,TK_LITERAL_FLOAT);
          if (bVar1) {
            this_00 = (IdentifierExpression *)operator_new(0x58);
            Token::Token((Token *)local_e8,(this->matched)._M_current);
            LiteralFloatExpression::LiteralFloatExpression
                      ((LiteralFloatExpression *)this_00,(Token *)local_e8);
            this_01 = (string *)(local_e8 + 0x10);
          }
          else {
            bVar1 = match(this,TK_LITERAL_DOUBLE);
            if (bVar1) {
              this_00 = (IdentifierExpression *)operator_new(0x58);
              Token::Token((Token *)local_118,(this->matched)._M_current);
              LiteralDoubleExpression::LiteralDoubleExpression
                        ((LiteralDoubleExpression *)this_00,(Token *)local_118);
              this_01 = (string *)(local_118 + 0x10);
            }
            else {
              bVar1 = match(this,TK_LITERAL_STRING);
              if (bVar1) {
                this_00 = (IdentifierExpression *)operator_new(0x58);
                Token::Token((Token *)local_148,(this->matched)._M_current);
                LiteralStringExpression::LiteralStringExpression
                          ((LiteralStringExpression *)this_00,(Token *)local_148);
                this_01 = (string *)(local_148 + 0x10);
              }
              else {
                bVar1 = match(this,TK_LITERAL_SYMBOL);
                if (bVar1) {
                  this_00 = (IdentifierExpression *)operator_new(0x58);
                  Token::Token((Token *)local_178,(this->matched)._M_current);
                  LiteralSymbolExpression::LiteralSymbolExpression
                            ((LiteralSymbolExpression *)this_00,(Token *)local_178);
                  this_01 = (string *)(local_178 + 0x10);
                }
                else {
                  bVar1 = match(this,TK_NULL);
                  if (bVar1) {
                    this_00 = (IdentifierExpression *)operator_new(0x58);
                    Token::Token((Token *)local_1a8,(this->matched)._M_current);
                    LiteralNullExpression::LiteralNullExpression
                              ((LiteralNullExpression *)this_00,(Token *)local_1a8);
                    this_01 = (string *)(local_1a8 + 0x10);
                  }
                  else {
                    bVar1 = match(this,TK_TRUE);
                    if (bVar1) {
                      this_00 = (IdentifierExpression *)operator_new(0x58);
                      Token::Token((Token *)local_1d8,(this->matched)._M_current);
                      LiteralBoolExpression::LiteralBoolExpression
                                ((LiteralBoolExpression *)this_00,(Token *)local_1d8);
                      this_01 = (string *)(local_1d8 + 0x10);
                    }
                    else {
                      bVar1 = match(this,TK_FALSE);
                      if (!bVar1) {
                        bVar1 = lookahead(this,TK_LEFT_SQUARE_BRACKET);
                        if (bVar1) {
                          this_00 = (IdentifierExpression *)parse_list_expression(this);
                        }
                        else {
                          bVar1 = lookahead(this,TK_LEFT_CURLY_BRACKET);
                          if (bVar1) {
                            this_00 = (IdentifierExpression *)parse_array_expression(this);
                          }
                          else {
                            this_00 = parse_identifier_expression(this);
                          }
                        }
                        goto LAB_00156499;
                      }
                      this_00 = (IdentifierExpression *)operator_new(0x58);
                      Token::Token((Token *)local_208,(this->matched)._M_current);
                      LiteralBoolExpression::LiteralBoolExpression
                                ((LiteralBoolExpression *)this_00,(Token *)local_208);
                      this_01 = (string *)(local_208 + 0x10);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(this_01);
  }
LAB_00156499:
  std::__cxx11::string::~string((string *)&oper.lexem);
  return &this_00->super_Expression;
}

Assistant:

Expression* Parser::parse_primary_expression() {
    Expression* expression = NULL;
    Token oper;

    if (match(TK_LEFT_PARENTHESIS)) {
        oper = *matched;
        expression = new ParenthesisExpression(oper, parse_expression());
        expect(TK_RIGHT_PARENTHESIS);
    } else if (match(TK_DOLAR)) {
        oper = *matched;

        expect(TK_LITERAL_STRING);
        expression = new DolarExpression(oper, new LiteralStringExpression(*matched));
    } else if (match(TK_AT)) {
        oper = *matched;
        expression = new AtExpression(oper, parse_identifier_expression());
    } else if (match(TK_LITERAL_INTEGER)) {
        expression = new LiteralIntegerExpression(*matched);
    } else if (match(TK_LITERAL_CHAR)) {
        expression = new LiteralCharExpression(*matched);
    } else if (match(TK_LITERAL_FLOAT)) {
        expression = new LiteralFloatExpression(*matched);
    } else if (match(TK_LITERAL_DOUBLE)) {
        expression = new LiteralDoubleExpression(*matched);
    } else if (match(TK_LITERAL_STRING)) {
        expression = new LiteralStringExpression(*matched);
    } else if (match(TK_LITERAL_SYMBOL)) {
        expression = new LiteralSymbolExpression(*matched);
    } else if (match(TK_NULL)) {
        expression = new LiteralNullExpression(*matched);
    } else if (match(TK_TRUE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (match(TK_FALSE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (lookahead(TK_LEFT_SQUARE_BRACKET)) {
        expression = parse_list_expression();
    } else if (lookahead(TK_LEFT_CURLY_BRACKET)) {
        expression = parse_array_expression();
    } else {
        expression = parse_identifier_expression();
    }

    return expression; 
}